

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O2

cio_bs_state
call_handler(cio_buffered_stream *buffered_stream,cio_error err,cio_read_buffer *read_buffer,
            size_t num_bytes)

{
  bool bVar1;
  
  buffered_stream->read_job = (_func_cio_bs_state_cio_buffered_stream_ptr *)0x0;
  buffered_stream->callback_is_running = buffered_stream->callback_is_running + 1;
  (*buffered_stream->read_handler)
            (buffered_stream,buffered_stream->read_handler_context,err,read_buffer,num_bytes);
  buffered_stream->callback_is_running = buffered_stream->callback_is_running - 1;
  bVar1 = buffered_stream->shall_close == true;
  if (bVar1) {
    (*buffered_stream->stream->close)(buffered_stream->stream);
  }
  return (uint)bVar1;
}

Assistant:

static enum cio_bs_state call_handler(struct cio_buffered_stream *buffered_stream, enum cio_error err, struct cio_read_buffer *read_buffer, size_t num_bytes)
{
	buffered_stream->read_job = NULL;
	buffered_stream->callback_is_running++;
	buffered_stream->read_handler(buffered_stream, buffered_stream->read_handler_context, err, read_buffer, num_bytes);
	buffered_stream->callback_is_running--;

	if (buffered_stream->shall_close) {
		buffered_stream->stream->close(buffered_stream->stream);
		return CIO_BS_CLOSED;
	}

	return CIO_BS_OPEN;
}